

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  int iVar1;
  char *pcVar2;
  undefined6 in_stack_ffffffffffffffa0;
  byte bVar3;
  char *string_value;
  String env_var;
  bool default_value_local;
  char *flag_local;
  
  env_var.length_._7_1_ = default_value;
  FlagToEnvVar((internal *)&string_value,flag);
  pcVar2 = String::c_str((String *)&string_value);
  pcVar2 = posix::GetEnv(pcVar2);
  bVar3 = env_var.length_._7_1_;
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(pcVar2,"0");
    bVar3 = iVar1 != 0;
  }
  String::~String((String *)CONCAT17(bVar3,CONCAT16(bVar3,in_stack_ffffffffffffffa0)));
  return (bool)(bVar3 & 1);
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
}